

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

XmlWriter * __thiscall Catch::XmlWriter::writeAttribute(XmlWriter *this,string *name,bool attribute)

{
  char *pcVar1;
  ostream *poVar2;
  undefined3 in_register_00000011;
  
  poVar2 = std::operator<<(this->m_os," ");
  poVar2 = std::operator<<(poVar2,(string *)name);
  poVar2 = std::operator<<(poVar2,"=\"");
  pcVar1 = "result.operator bool() == false";
  if (CONCAT31(in_register_00000011,attribute) != 0) {
    pcVar1 = "result.operator bool() == true";
  }
  poVar2 = std::operator<<(poVar2,pcVar1 + 0x1a);
  std::operator<<(poVar2,"\"");
  return this;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, bool attribute ) {
            stream() << " " << name << "=\"" << ( attribute ? "true" : "false" ) << "\"";
            return *this;
        }